

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gazetteer.pb.cc
# Opt level: O3

Gazetteer * __thiscall
CoreML::Specification::CoreMLModels::Gazetteer::New(Gazetteer *this,Arena *arena)

{
  Gazetteer *this_00;
  
  this_00 = (Gazetteer *)operator_new(0x38);
  Gazetteer(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::CoreMLModels::Gazetteer>(arena,this_00);
  }
  return this_00;
}

Assistant:

Gazetteer* Gazetteer::New(::google::protobuf::Arena* arena) const {
  Gazetteer* n = new Gazetteer;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}